

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushFocusScope(ImGuiID id)

{
  int *piVar1;
  int iVar2;
  uint *puVar3;
  ImGuiContext *pIVar4;
  uint *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  iVar6 = (GImGui->FocusScopeStack).Size;
  iVar2 = (GImGui->FocusScopeStack).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
      puVar3 = (pIVar4->FocusScopeStack).Data;
      if (puVar3 != (uint *)0x0) {
        memcpy(__dest,puVar3,(long)(pIVar4->FocusScopeStack).Size << 2);
        puVar3 = (pIVar4->FocusScopeStack).Data;
        if ((puVar3 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
      }
      (pIVar4->FocusScopeStack).Data = __dest;
      (pIVar4->FocusScopeStack).Capacity = iVar6;
    }
  }
  (pIVar4->FocusScopeStack).Data[(pIVar4->FocusScopeStack).Size] = id;
  (pIVar4->FocusScopeStack).Size = (pIVar4->FocusScopeStack).Size + 1;
  pIVar4->CurrentFocusScopeId = id;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    g.FocusScopeStack.push_back(id);
    g.CurrentFocusScopeId = id;
}